

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_msb.hpp
# Opt level: O0

uint16_t ans_msb_mapping_and_exceptions(uint32_t x,uint8_t **except_out)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t **except_out_local;
  uint32_t x_local;
  uint16_t local_2;
  
  if (x < 0x101) {
    local_2 = (uint16_t)x;
  }
  else {
    uVar2 = (uint8_t)x;
    if (x < 0x10001) {
      puVar1 = *except_out;
      *except_out = puVar1 + 1;
      *puVar1 = uVar2;
      local_2 = (short)(x >> 8) + 0x100;
    }
    else {
      uVar3 = (uint8_t)(x >> 8);
      if (x < 0x1000001) {
        puVar1 = *except_out;
        *except_out = puVar1 + 1;
        *puVar1 = uVar2;
        puVar1 = *except_out;
        *except_out = puVar1 + 1;
        *puVar1 = uVar3;
        local_2 = (short)(x >> 0x10) + 0x200;
      }
      else {
        puVar1 = *except_out;
        *except_out = puVar1 + 1;
        *puVar1 = uVar2;
        puVar1 = *except_out;
        *except_out = puVar1 + 1;
        *puVar1 = uVar3;
        puVar1 = *except_out;
        *except_out = puVar1 + 1;
        *puVar1 = (uint8_t)(x >> 0x10);
        local_2 = (byte)(x >> 0x18) + 0x300;
      }
    }
  }
  return local_2;
}

Assistant:

uint16_t ans_msb_mapping_and_exceptions(uint32_t x, uint8_t*& except_out)
{
    if (x <= 256) {
        return x;
    }
    if (x <= (1 << 16)) {
        // one exception byte
        *except_out++ = x & 0xFF;
        return (x >> 8) + 256;
    }
    if (x <= (1 << 24)) {
        // two exception byte
        *except_out++ = x & 0xFF;
        *except_out++ = (x >> 8) & 0xFF;
        return (x >> 16) + 512;
    }
    // three exception byte
    *except_out++ = x & 0xFF;
    *except_out++ = (x >> 8) & 0xFF;
    *except_out++ = (x >> 16) & 0xFF;
    return (x >> 24) + 768;
}